

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_tree.c
# Opt level: O1

uint8_t * openMerkleTree(tree_t *tree,uint16_t *missingLeaves,size_t missingLeavesSize,
                        size_t *outputSizeBytes)

{
  uint uVar1;
  uint8_t *puVar2;
  size_t sVar3;
  uint *__ptr;
  uint8_t *puVar4;
  uint8_t *__dest;
  size_t sVar5;
  ulong __n;
  size_t revealedSize;
  size_t local_38;
  
  local_38 = 0;
  __ptr = getRevealedMerkleNodes(tree,missingLeaves,missingLeavesSize,&local_38);
  sVar3 = local_38;
  if (__ptr == (uint *)0x0) {
    puVar4 = (uint8_t *)0x0;
  }
  else {
    uVar1 = tree->dataSize;
    __n = (ulong)uVar1;
    *outputSizeBytes = local_38 * __n;
    puVar4 = (uint8_t *)malloc(local_38 * __n);
    if (puVar4 == (uint8_t *)0x0) {
      puVar4 = (uint8_t *)0x0;
    }
    else if (sVar3 != 0) {
      puVar2 = tree->nodes;
      sVar5 = 0;
      __dest = puVar4;
      do {
        memcpy(__dest,puVar2 + __ptr[sVar5] * uVar1,__n);
        __dest = __dest + __n;
        sVar5 = sVar5 + 1;
      } while (sVar3 != sVar5);
    }
    free(__ptr);
  }
  return puVar4;
}

Assistant:

uint8_t* openMerkleTree(tree_t* tree, uint16_t* missingLeaves, size_t missingLeavesSize,
                        size_t* outputSizeBytes) {
  size_t revealedSize = 0;
  unsigned int* revealed =
      getRevealedMerkleNodes(tree, missingLeaves, missingLeavesSize, &revealedSize);
  if (!revealed) {
    return NULL;
  }

  /* Serialize output */
  *outputSizeBytes = revealedSize * tree->dataSize;
  uint8_t* output  = malloc(*outputSizeBytes);
  if (!output) {
    free(revealed);
    return NULL;
  }

  uint8_t* outputBase = output;
  for (size_t i = 0; i < revealedSize; i++) {
    memcpy(output, &tree->nodes[revealed[i] * tree->dataSize], tree->dataSize);
    output += tree->dataSize;
  }

  free(revealed);
  return outputBase;
}